

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int coda_get_product_version(coda_product *product,int *version)

{
  int *version_local;
  coda_product *product_local;
  
  if (product == (coda_product *)0x0) {
    coda_set_error(-100,"product file argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,1000);
    product_local._4_4_ = -1;
  }
  else if (version == (int *)0x0) {
    coda_set_error(-100,"version argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x3ed);
    product_local._4_4_ = -1;
  }
  else {
    if (product->product_definition == (coda_product_definition *)0x0) {
      *version = -1;
    }
    else {
      *version = product->product_definition->version;
    }
    product_local._4_4_ = 0;
  }
  return product_local._4_4_;
}

Assistant:

LIBCODA_API int coda_get_product_version(const coda_product *product, int *version)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (version == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "version argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product->product_definition != NULL)
    {
        *version = product->product_definition->version;
    }
    else
    {
        *version = -1;
    }

    return 0;
}